

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O3

uint ecc_weierstrass_point_valid(WeierstrassPoint *P)

{
  WeierstrassCurve *pWVar1;
  uint uVar2;
  mp_int *a;
  mp_int *x;
  mp_int *x_00;
  mp_int *x_01;
  mp_int *y;
  mp_int *x_02;
  mp_int *y_00;
  mp_int *x_03;
  mp_int *y_01;
  mp_int *y_02;
  mp_int *b;
  
  pWVar1 = P->wc;
  a = monty_mul(pWVar1->mc,P->Y,P->Y);
  x = monty_mul(pWVar1->mc,P->X,P->X);
  x_00 = monty_mul(pWVar1->mc,x,P->X);
  x_01 = monty_mul(pWVar1->mc,P->Z,P->Z);
  y = monty_mul(pWVar1->mc,x_01,x_01);
  x_02 = monty_mul(pWVar1->mc,pWVar1->a,y);
  y_00 = monty_mul(pWVar1->mc,x_02,P->X);
  x_03 = monty_add(pWVar1->mc,x_00,y_00);
  y_01 = monty_mul(pWVar1->mc,x_01,y);
  y_02 = monty_mul(pWVar1->mc,pWVar1->b,y_01);
  b = monty_add(pWVar1->mc,x_03,y_02);
  uVar2 = mp_cmp_eq(a,b);
  mp_free(a);
  mp_free(x);
  mp_free(x_00);
  mp_free(x_01);
  mp_free(y);
  mp_free(x_02);
  mp_free(y_00);
  mp_free(x_03);
  mp_free(y_01);
  mp_free(y_02);
  mp_free(b);
  return uVar2;
}

Assistant:

unsigned ecc_weierstrass_point_valid(WeierstrassPoint *P)
{
    WeierstrassCurve *wc = P->wc;

    /*
     * The projective version of the curve equation is
     * Y^2 = X^3 + a X Z^4 + b Z^6
     */
    mp_int *lhs = monty_mul(P->wc->mc, P->Y, P->Y);
    mp_int *x2 = monty_mul(wc->mc, P->X, P->X);
    mp_int *x3 = monty_mul(wc->mc, x2, P->X);
    mp_int *z2 = monty_mul(wc->mc, P->Z, P->Z);
    mp_int *z4 = monty_mul(wc->mc, z2, z2);
    mp_int *az4 = monty_mul(wc->mc, wc->a, z4);
    mp_int *axz4 = monty_mul(wc->mc, az4, P->X);
    mp_int *x3_plus_axz4 = monty_add(wc->mc, x3, axz4);
    mp_int *z6 = monty_mul(wc->mc, z2, z4);
    mp_int *bz6 = monty_mul(wc->mc, wc->b, z6);
    mp_int *rhs = monty_add(wc->mc, x3_plus_axz4, bz6);

    unsigned valid = mp_cmp_eq(lhs, rhs);

    mp_free(lhs);
    mp_free(x2);
    mp_free(x3);
    mp_free(z2);
    mp_free(z4);
    mp_free(az4);
    mp_free(axz4);
    mp_free(x3_plus_axz4);
    mp_free(z6);
    mp_free(bz6);
    mp_free(rhs);

    return valid;
}